

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::OpportunisticPeeling(Codec *this,uint16_t row_i,uint32_t row_seed)

{
  PeelRefs *pPVar1;
  short sVar2;
  ushort uVar3;
  uint32_t in_EDX;
  ushort in_SI;
  Codec *in_RDI;
  PeelRefs *refs;
  uint16_t column_i;
  uint16_t unmarked [2];
  uint16_t unmarked_count;
  PeelRowIterator iter;
  PeelRow *row;
  uint16_t distanceToP;
  ushort local_68 [2];
  uint16_t in_stack_ffffffffffffff9c;
  ushort uVar4;
  uint16_t in_stack_ffffffffffffff9e;
  undefined2 uVar5;
  ushort uVar6;
  short sVar7;
  uint32_t in_stack_ffffffffffffffa0;
  uint16_t uVar8;
  ushort uVar9;
  bool bVar10;
  uint32_t in_stack_ffffffffffffffa4;
  undefined1 uVar11;
  PeelRow *row_00;
  
  row_00 = in_RDI->_peel_rows + in_SI;
  row_00->RecoveryId = in_EDX;
  PeelRowParameters::Initialize
            ((PeelRowParameters *)row_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c);
  uVar5 = 0;
  uVar8 = 0;
  uVar8 = 0;
  bVar10 = false;
  uVar11 = 0;
  uVar8 = (row_00->Params).PeelFirst;
  sVar2 = (row_00->Params).PeelCount - 1;
  uVar8 = (row_00->Params).PeelAdd;
  uVar8 = in_RDI->_block_count;
  uVar8 = in_RDI->_block_next_prime;
  uVar4 = 0;
  do {
    uVar6 = (ushort)in_stack_ffffffffffffffa0;
    pPVar1 = in_RDI->_peel_col_refs + uVar6;
    if (0x1f < pPVar1->RowCount) {
      FixPeelFailure(in_RDI,row_00,uVar6);
      return false;
    }
    uVar3 = pPVar1->RowCount;
    pPVar1->RowCount = uVar3 + 1;
    pPVar1->Rows[uVar3] = in_SI;
    if (in_RDI->_peel_cols[uVar6].Mark == '\0') {
      uVar3 = uVar4 + 1;
      local_68[(int)(uVar4 & 1)] = uVar6;
      uVar4 = uVar3;
    }
    if (sVar2 == 0) {
      bVar10 = false;
    }
    else {
      sVar2 = sVar2 + -1;
      uVar3 = (ushort)(in_stack_ffffffffffffffa4 >> 0x10);
      uVar9 = (ushort)(in_stack_ffffffffffffffa0 >> 0x10);
      uVar6 = (ushort)((ulong)((in_stack_ffffffffffffffa0 & 0xffff) + (uint)uVar9) %
                      (ulong)(long)(int)(uint)uVar3);
      if ((ushort)in_stack_ffffffffffffffa4 <= uVar6) {
        uVar3 = uVar3 - uVar6;
        if (uVar9 < uVar3) {
          uVar5 = (short)(((uint)uVar9 * 0x10000 - (uint)uVar3) % (uint)uVar9);
        }
        else {
          sVar7 = uVar9 - uVar3;
        }
      }
      bVar10 = true;
    }
  } while (bVar10);
  row_00->UnmarkedCount = uVar4;
  if (uVar4 == 0) {
    row_00->NextRow = in_RDI->_defer_head_rows;
    in_RDI->_defer_head_rows = in_SI;
  }
  else if (uVar4 == 1) {
    SolveWithPeel((Codec *)&stack0xffffffffffffff9e,(PeelRow *)in_RDI,
                  (uint16_t)((ulong)&stack0xffffffffffffff9e >> 0x30),
                  (uint16_t)((ulong)&stack0xffffffffffffff9e >> 0x20));
  }
  else if (uVar4 == 2) {
    (row_00->Marks).Unmarked[0] = local_68[0];
    (row_00->Marks).Unmarked[1] = local_68[1];
    in_RDI->_peel_cols[local_68[0]].field_1.Weight2Refs =
         in_RDI->_peel_cols[local_68[0]].field_1.Weight2Refs + 1;
    in_RDI->_peel_cols[local_68[1]].field_1.Weight2Refs =
         in_RDI->_peel_cols[local_68[1]].field_1.Weight2Refs + 1;
  }
  return true;
}

Assistant:

bool Codec::OpportunisticPeeling(
    const uint16_t row_i, ///< Row index
    const uint32_t row_seed ///< Row PRNG seed
)
{
    PeelRow *row = &_peel_rows[row_i];

    row->RecoveryId = row_seed;

    row->Params.Initialize(row_seed, _p_seed, _block_count, _mix_count);

    CAT_IF_DUMP(cout << "Row " << row_seed << " in slot " << row_i << " of weight "
        << row->Params.PeelCount << " [a=" << row->Params.PeelAdd << "] : ";)

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

    uint16_t unmarked_count = 0;
    uint16_t unmarked[2];

    // Iterate columns in peeling matrix
    do
    {
        const uint16_t column_i = iter.GetColumn();

        CAT_IF_DUMP(cout << column_i << " ";)

        PeelRefs *refs = &_peel_col_refs[column_i];

        // If there was not enough room in the reference list:
        if (refs->RowCount >= CAT_REF_LIST_MAX)
        {
            CAT_IF_DUMP(cout << "OpportunisticPeeling: Failure!  " \
                "Ran out of space for row references.  CAT_REF_LIST_MAX must be increased!" << endl;)

            CAT_DEBUG_BREAK();

            FixPeelFailure(row, column_i);

            return false;
        }

        // Add row reference to column
        refs->Rows[refs->RowCount++] = row_i;

        // If column is unmarked:
        if (_peel_cols[column_i].Mark == MARK_TODO) {
            unmarked[unmarked_count++ & 1] = column_i;
        }
    } while (iter.Iterate());

    CAT_IF_DUMP(cout << endl;)

    // Initialize row state
    row->UnmarkedCount = unmarked_count;

    switch (unmarked_count)
    {
    case 0:
        // Link at head of defer list
        row->NextRow = _defer_head_rows;
        _defer_head_rows = row_i;
        break;

    case 1:
        // Solve only unmarked column with this row
        SolveWithPeel(
            row,
            row_i,
            unmarked[0]);
        break;

    case 2:
        // Remember which two columns were unmarked
        row->Marks.Unmarked[0] = unmarked[0];
        row->Marks.Unmarked[1] = unmarked[1];

        // Increment weight-2 reference count for unmarked columns
        _peel_cols[unmarked[0]].Weight2Refs++;
        _peel_cols[unmarked[1]].Weight2Refs++;
        break;
    }

    return true;
}